

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceDirWrapper.cpp
# Opt level: O2

QString * __thiscall
ResourceLeafWrapper::getFieldName
          (QString *__return_storage_ptr__,ResourceLeafWrapper *this,size_t fieldId)

{
  char *ch;
  
  if (fieldId < 4) {
    ch = &DAT_001369d8 + *(int *)(&DAT_001369d8 + fieldId * 4);
  }
  else {
    ch = "";
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString ResourceLeafWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case OFFSET_TO_DATA: return "OffsetToData";
        case DATA_SIZE: return "DataSize";
        case CODE_PAGE: return "CodePage";
        case RESERVED: return "Reserved";
    }
    return "";
}